

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  ushort uVar1;
  uint uVar2;
  TRef TVar3;
  jit_State *pjVar4;
  long lVar5;
  GCobj *o;
  cTValue *J_00;
  ushort *puVar6;
  uint in_ESI;
  long in_RDI;
  IRIns *load;
  IRIns *key;
  cTValue *tv;
  TValue keyv;
  IRIns *store_1;
  IRIns *newref;
  IRRef ref2;
  IRRef tab;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRIns *xr;
  undefined4 in_stack_ffffffffffffff78;
  AliasRet in_stack_ffffffffffffff7c;
  jit_State *J_01;
  undefined4 in_stack_ffffffffffffff88;
  AliasRet in_stack_ffffffffffffff8c;
  TValue *in_stack_ffffffffffffff90;
  IRType t;
  IRIns *in_stack_ffffffffffffffa8;
  IRIns *in_stack_ffffffffffffffb0;
  jit_State *in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_28;
  uint local_24;
  
  pjVar4 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)in_ESI * 8);
  uVar1 = *(ushort *)(in_RDI + 0x140 + (long)(int)(*(byte *)(in_RDI + 0x9d) + 7) * 2);
  while (local_28 = (uint)uVar1, in_ESI < local_28) {
    lVar5 = *(long *)(in_RDI + 0x10) + (ulong)local_28 * 8;
    in_stack_ffffffffffffff8c =
         aa_ahref(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (in_stack_ffffffffffffff8c != ALIAS_NO) {
      if (in_stack_ffffffffffffff8c == ALIAS_MAY) {
        local_24 = local_28;
        goto LAB_00144d30;
      }
      if (in_stack_ffffffffffffff8c == ALIAS_MUST) {
        return (uint)*(ushort *)(lVar5 + 2);
      }
    }
    uVar1 = *(ushort *)(lVar5 + 6);
  }
  if (((pjVar4->cur).gct == '9') || (J_01 = pjVar4, (pjVar4->cur).gct == '8')) {
    J_01 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(ushort)(pjVar4->cur).nextgc.gcptr32 * 8)
    ;
  }
  uVar2 = (uint)(ushort)(J_01->cur).nextgc.gcptr32;
  lVar5 = *(long *)(in_RDI + 0x10) + (ulong)uVar2 * 8;
  local_24 = in_ESI;
  if ((*(char *)(lVar5 + 5) == 'N') ||
     ((*(char *)(lVar5 + 5) == 'O' &&
      (*(ushort *)((long)&(pjVar4->cur).nextgc.gcptr32 + 2) < 0x8000)))) {
    if ((pjVar4->cur).gct == '8') {
      uVar1 = *(ushort *)(in_RDI + 0x1b6);
      while (local_40 = (uint)uVar1, uVar2 < local_40) {
        in_stack_ffffffffffffffb8 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_40 * 8);
        if ((*(byte *)(*(long *)(in_RDI + 0x10) + 4 +
                      (ulong)*(ushort *)((long)&(in_stack_ffffffffffffffb8->cur).nextgc.gcptr32 + 2)
                      * 8) & 0x1f) == 0xe) goto LAB_00144d30;
        uVar1._0_1_ = (in_stack_ffffffffffffffb8->cur).topslot;
        uVar1._1_1_ = (in_stack_ffffffffffffffb8->cur).linktype;
      }
    }
    while (uVar2 < local_28) {
      in_stack_ffffffffffffffb0 = (IRIns *)(*(long *)(in_RDI + 0x10) + (ulong)local_28 * 8);
      in_stack_ffffffffffffff7c =
           aa_ahref(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (in_stack_ffffffffffffff7c != ALIAS_NO) {
        if (in_stack_ffffffffffffff7c == ALIAS_MAY) goto LAB_00144d30;
        if (in_stack_ffffffffffffff7c == ALIAS_MUST) {
          return (uint)(in_stack_ffffffffffffffb0->field_0).op2;
        }
      }
      local_28 = (uint)(in_stack_ffffffffffffffb0->field_0).prev;
    }
    if ((*(byte *)(in_RDI + 0x9c) & 0x1f) < 3) {
      return (0x7fff - (*(byte *)(in_RDI + 0x9c) & 0x1f)) +
             (*(byte *)(in_RDI + 0x9c) & 0x1f) * 0x1000000;
    }
    if (((*(byte *)(in_RDI + 0x9c) & 0x1f) == 0xe) || ((*(byte *)(in_RDI + 0x9c) & 0x1f) == 4)) {
      o = (GCobj *)(*(long *)(in_RDI + 0x10) +
                   (ulong)*(ushort *)((long)&(pjVar4->cur).nextgc.gcptr32 + 2) * 8);
      if ((o->gch).gct == '\x1d') {
        o = (GCobj *)(*(long *)(in_RDI + 0x10) + (ulong)*(ushort *)o * 8);
      }
      lj_ir_kvalue(&o->th,in_stack_ffffffffffffff90,
                   (IRIns *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      t = (IRType)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      J_00 = lj_tab_get((lua_State *)in_stack_ffffffffffffffb8,
                        (GCtab *)&in_stack_ffffffffffffffb0->field_0,
                        (cTValue *)in_stack_ffffffffffffffa8);
      if ((*(byte *)(in_RDI + 0x9c) & 0x1f) == 0xe) {
        TVar3 = lj_ir_knum_u64(J_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        return TVar3;
      }
      TVar3 = lj_ir_kgc((jit_State *)&J_00->field_2,o,t);
      return TVar3;
    }
  }
LAB_00144d30:
  uVar1 = *(ushort *)(in_RDI + 0x140 + (ulong)*(byte *)(in_RDI + 0x9d) * 2);
  while( true ) {
    local_28 = (uint)uVar1;
    if (local_28 <= local_24) {
      return 0;
    }
    puVar6 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)local_28 * 8);
    if (*puVar6 == in_ESI) break;
    uVar1 = puVar6[3];
  }
  return local_28;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      lua_assert(ir->o != IR_TNEW || irt_isnil(fins->t));
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lua_assert(itype2irt(tv) == irt_type(fins->t));
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}